

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O1

void __thiscall
antlr::NoViableAltException::NoViableAltException(NoViableAltException *this,RefAST *t)

{
  ASTRef *pAVar1;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"NoViableAlt","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"<AST>","");
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_40,&local_60,-1,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__NoViableAltException_002fc518;
  (this->token).ref = (TokenRef *)0x0;
  pAVar1 = t->ref;
  if (pAVar1 == (ASTRef *)0x0) {
    pAVar1 = (ASTRef *)0x0;
  }
  else {
    pAVar1->count = pAVar1->count + 1;
  }
  (this->node).ref = pAVar1;
  return;
}

Assistant:

NoViableAltException::NoViableAltException(RefAST t)
  : RecognitionException("NoViableAlt","<AST>",-1,-1),
    token(0), node(t)
{
}